

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O2

bool absl::lts_20250127::StrContainsIgnoreCase(string_view haystack,string_view needle)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  string_view text;
  
  pcVar2 = haystack._M_str;
  for (uVar3 = haystack._M_len; needle._M_len <= uVar3; uVar3 = uVar3 - 1) {
    text._M_str = pcVar2;
    text._M_len = uVar3;
    bVar1 = StartsWithIgnoreCase(text,needle);
    if (bVar1) break;
    pcVar2 = pcVar2 + 1;
  }
  return needle._M_len <= uVar3;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           absl::string_view needle) noexcept {
  while (haystack.size() >= needle.size()) {
    if (StartsWithIgnoreCase(haystack, needle)) return true;
    haystack.remove_prefix(1);
  }
  return false;
}